

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestCaseFilters::shouldInclude(TestCaseFilters *this,TestCase *testCase)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tags;
  pointer pTVar1;
  TagSet *pTVar2;
  pointer pTVar3;
  TestCaseFilter *this_00;
  TestCaseFilter *pTVar4;
  TestCaseFilter *pTVar5;
  bool bVar6;
  TagSet *this_01;
  const_iterator it;
  pointer pTVar7;
  const_iterator it_1;
  pointer this_02;
  TestCaseFilter *this_03;
  bool bVar8;
  
  pTVar7 = (this->m_tagExpressions).
           super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->m_tagExpressions).
           super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar7 == pTVar1) {
LAB_0013cd99:
    this_02 = (this->m_inclusionFilters).
              super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->m_inclusionFilters).
             super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_02 == pTVar3) {
      if (((this->m_exclusionFilters).
           super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl
           .super__Vector_impl_data._M_start ==
           (this->m_exclusionFilters).
           super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>._M_impl
           .super__Vector_impl_data._M_finish) &&
         ((this->m_tagExpressions).
          super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->m_tagExpressions).
          super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        return (bool)((testCase->super_TestCaseInfo).isHidden ^ 1);
      }
    }
    else {
      do {
        bVar8 = TestCaseFilter::isMatch(this_02,testCase);
        if ((this_02->m_filterType != IncludeTests) != bVar8) break;
        this_02 = this_02 + 1;
      } while (this_02 != pTVar3);
      if (this_02 == pTVar3) goto LAB_0013cdcb;
    }
    this_00 = (this->m_exclusionFilters).
              super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (this->m_exclusionFilters).
             super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar8 = this_00 == pTVar4;
    if ((!bVar8) &&
       (bVar6 = TestCaseFilter::isMatch(this_00,testCase),
       bVar6 != (this_00->m_filterType != IncludeTests))) {
      do {
        this_03 = this_00 + 1;
        bVar8 = this_03 == pTVar4;
        if (bVar8) {
          return bVar8;
        }
        bVar6 = TestCaseFilter::isMatch(this_03,testCase);
        pTVar5 = this_00 + 1;
        this_00 = this_03;
      } while ((pTVar5->m_filterType != IncludeTests) != bVar6);
    }
  }
  else {
    tags = &(testCase->super_TestCaseInfo).tags;
    do {
      this_01 = (pTVar7->m_tagSets).
                super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar2 = (pTVar7->m_tagSets).super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar8 = this_01 != pTVar2;
      if (bVar8) {
        bVar6 = TagSet::matches(this_01,tags);
        while (!bVar6) {
          this_01 = this_01 + 1;
          bVar8 = this_01 != pTVar2;
          if (this_01 == pTVar2) break;
          bVar6 = TagSet::matches(this_01,tags);
        }
      }
    } while ((!bVar8) && (pTVar7 = pTVar7 + 1, pTVar7 != pTVar1));
    if (pTVar7 != pTVar1) goto LAB_0013cd99;
LAB_0013cdcb:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool shouldInclude( TestCase const& testCase ) const {
            if( !m_tagExpressions.empty() ) {
                std::vector<TagExpression>::const_iterator it = m_tagExpressions.begin();
                std::vector<TagExpression>::const_iterator itEnd = m_tagExpressions.end();
                for(; it != itEnd; ++it )
                    if( it->matches( testCase.getTags() ) )
                        break;
                if( it == itEnd )
                    return false;
            }

            if( !m_inclusionFilters.empty() ) {
                std::vector<TestCaseFilter>::const_iterator it = m_inclusionFilters.begin();
                std::vector<TestCaseFilter>::const_iterator itEnd = m_inclusionFilters.end();
                for(; it != itEnd; ++it )
                    if( it->shouldInclude( testCase ) )
                        break;
                if( it == itEnd )
                    return false;
            }
            else if( m_exclusionFilters.empty() && m_tagExpressions.empty() ) {
                return !testCase.isHidden();
            }

            std::vector<TestCaseFilter>::const_iterator it = m_exclusionFilters.begin();
            std::vector<TestCaseFilter>::const_iterator itEnd = m_exclusionFilters.end();
            for(; it != itEnd; ++it )
                if( !it->shouldInclude( testCase ) )
                    return false;
            return true;
        }